

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O3

DebuggerScope * Js::LocalsWalker::GetScopeWhenHaltAtFormals(DiagStackFrame *frame)

{
  DebuggerScope *this;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  FunctionBody *this_00;
  ScopeObjectChain *pSVar3;
  Type *pTVar4;
  List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *this_01
  ;
  
  iVar2 = (*frame->_vptr_DiagStackFrame[2])();
  this_00 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)CONCAT44(extraout_var,iVar2));
  pSVar3 = FunctionBody::GetScopeObjectChain(this_00);
  if (((pSVar3 != (ScopeObjectChain *)0x0) &&
      (this_01 = (pSVar3->pScopeChain).ptr,
      this_01 !=
      (List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *)
      0x0)) && (0 < (this_01->
                    super_ReadOnlyList<Js::DebuggerScope_*,_Memory::Recycler,_DefaultComparer>).
                    count)) {
    iVar2 = 0;
    do {
      pTVar4 = JsUtil::
               List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ::Item(this_01,iVar2);
      this = pTVar4->ptr;
      bVar1 = DebuggerScope::IsParamScope(this);
      if (bVar1) {
        return this;
      }
      iVar2 = iVar2 + 1;
      this_01 = (pSVar3->pScopeChain).ptr;
    } while (iVar2 < (this_01->
                     super_ReadOnlyList<Js::DebuggerScope_*,_Memory::Recycler,_DefaultComparer>).
                     count);
  }
  return (DebuggerScope *)0x0;
}

Assistant:

DebuggerScope * LocalsWalker::GetScopeWhenHaltAtFormals(DiagStackFrame* frame)
    {
        Js::ScopeObjectChain * scopeObjectChain = frame->GetJavascriptFunction()->GetFunctionBody()->GetScopeObjectChain();

        if (scopeObjectChain != nullptr && scopeObjectChain->pScopeChain != nullptr)
        {
            for (int i = 0; i < scopeObjectChain->pScopeChain->Count(); i++)
            {
                Js::DebuggerScope * scope = scopeObjectChain->pScopeChain->Item(i);
                if (scope->IsParamScope())
                {
                    return scope;
                }
            }
        }

        return nullptr;
    }